

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_invalidate_phys_page_fast_arm
               (uc_struct_conflict1 *uc,page_collection *pages,tb_page_addr_t start,int len,
               uintptr_t retaddr)

{
  uint uVar1;
  uint uVar2;
  PageDesc *pages_00;
  unsigned_long *puVar3;
  uint uVar4;
  uint uVar5;
  uintptr_t in_R9;
  ulong uVar6;
  uint *puVar7;
  
  pages_00 = page_find_alloc(uc,start >> ((byte)uc->init_target_page->bits & 0x3f),0);
  if (pages_00 != (PageDesc *)0x0) {
    puVar3 = pages_00->code_bitmap;
    if (puVar3 == (unsigned_long *)0x0) {
      uVar4 = pages_00->code_write_count + 1;
      pages_00->code_write_count = uVar4;
      if (uVar4 < 10) goto LAB_00578e0f;
      puVar3 = (unsigned_long *)
               g_try_malloc0(0x3fU - (long)uc->init_target_page->mask >> 3 & 0xfffffffffffffff8);
      if (puVar3 == (unsigned_long *)0x0) {
        abort();
      }
      pages_00->code_bitmap = puVar3;
      uVar6 = pages_00->first_tb;
      puVar7 = (uint *)(uVar6 & 0xfffffffffffffffe);
      if (puVar7 != (uint *)0x0) {
        do {
          if ((uVar6 & 1) == 0) {
            uVar1 = uc->init_target_page->mask;
            uVar2 = *puVar7 & ~uVar1;
            uVar5 = (ushort)puVar7[3] + uVar2;
            uVar4 = -uVar1;
            if (SBORROW4(uVar5,-uVar1) != (int)(uVar5 + uVar1) < 0) {
              uVar4 = uVar5;
            }
          }
          else {
            uVar2 = 0;
            uVar4 = ~uc->init_target_page->mask & *puVar7 + (uint)(ushort)puVar7[3];
          }
          qemu_bitmap_set(pages_00->code_bitmap,(long)(int)uVar2,(long)(int)(uVar4 - uVar2));
          uVar6 = *(ulong *)(puVar7 + (ulong)((uint)uVar6 & 1) * 2 + 0xc);
          puVar7 = (uint *)(uVar6 & 0xfffffffffffffffe);
        } while (puVar7 != (uint *)0x0);
        puVar3 = pages_00->code_bitmap;
        if (puVar3 == (unsigned_long *)0x0) goto LAB_00578e0f;
      }
    }
    uVar4 = (uint)start & ~uc->init_target_page->mask;
    if (((uint)(puVar3[uVar4 >> 6] >> ((byte)uVar4 & 0x3f)) & ~(-1 << ((byte)len & 0x1f))) != 0) {
LAB_00578e0f:
      tb_invalidate_phys_page_range__locked
                (uc,(page_collection *)pages_00,(PageDesc *)start,(long)len + start,retaddr,in_R9);
      return;
    }
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_fast(struct uc_struct *uc, struct page_collection *pages,
                                  tb_page_addr_t start, int len,
                                  uintptr_t retaddr)
{
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (!p) {
        return;
    }

    assert_page_locked(p);
    if (!p->code_bitmap &&
        ++p->code_write_count >= SMC_BITMAP_USE_THRESHOLD) {
        build_page_bitmap(uc, p);
    }
    if (p->code_bitmap) {
        unsigned int nr;
        unsigned long b;

        nr = start & ~TARGET_PAGE_MASK;
        b = p->code_bitmap[BIT_WORD(nr)] >> (nr & (BITS_PER_LONG - 1));
        if (b & ((1 << len) - 1)) {
            goto do_invalidate;
        }
    } else {
    do_invalidate:
        tb_invalidate_phys_page_range__locked(uc, pages, p, start, start + len,
                                              retaddr);
    }
}